

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O3

bool __thiscall axl::io::SockAddrParser::parse(SockAddrParser *this,in6_addr *addr)

{
  void *__src;
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint_t word;
  uchar_t ip4 [4];
  uint_t octet;
  uint local_68;
  undefined4 local_64;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_60;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  skipWhiteSpace(this);
  pcVar1 = this->m_p;
  if ((pcVar1 < this->m_end) && (*pcVar1 == ':')) {
    this->m_p = pcVar1 + 1;
  }
  uVar5 = 0xffffffffffffffff;
  uVar4 = 2;
  do {
    skipWhiteSpace(this);
    pcVar1 = this->m_p;
    if ((pcVar1 < this->m_end) && (*pcVar1 == ':')) {
      uVar5 = uVar4 - 2;
      this->m_p = pcVar1 + 1;
    }
    bVar2 = parseInt(this,&local_68,0x10);
    if (!bVar2) goto LAB_0013ccc9;
    skipWhiteSpace(this);
    pcVar1 = this->m_p;
    if ((this->m_end <= pcVar1) || (*pcVar1 != ':')) {
      skipWhiteSpace(this);
      pcVar1 = this->m_p;
      if ((this->m_end <= pcVar1) || (*pcVar1 != '.')) {
        *(ushort *)((long)addr + uVar4 * 2 + -4) = (ushort)local_68 << 8 | (ushort)local_68 >> 8;
        uVar4 = uVar4 - 1;
        goto LAB_0013cbae;
      }
      this->m_p = pcVar1 + 1;
      if (uVar4 == 9) {
        err::Error::Error((Error *)&local_60,0x16);
        local_48.m_p = (ErrorHdr *)0x0;
        local_48.m_hdr = (BufHdr *)0x0;
        local_48.m_size = 0;
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_60);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_60);
        err::setError((ErrorRef *)&local_48);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
        goto LAB_0013ccc9;
      }
      local_64 = CONCAT31(local_64._1_3_,
                          ((byte)(local_68 >> 8) & 0xf) * 'd' +
                          ((byte)local_68 & 0xf) + ((byte)(local_68 >> 4) & 0xf) * '\n');
      bVar2 = parseInt(this,(uint_t *)&local_60,10);
      if (!bVar2) goto LAB_0013ccc9;
      lVar3 = 1;
      goto LAB_0013cc93;
    }
    this->m_p = pcVar1 + 1;
    *(ushort *)((long)addr + uVar4 * 2 + -4) = (ushort)local_68 << 8 | (ushort)local_68 >> 8;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  uVar4 = 8;
  if (uVar5 == 0xffffffffffffffff) {
    return true;
  }
LAB_0013cbb4:
  if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
    return true;
  }
  __src = (void *)((long)&addr->__in6_u + uVar5 * 2);
  memmove((void *)((long)__src + (8 - uVar4) * 2),__src,(uVar4 - uVar5) * 2);
  memset(__src,0,(8 - uVar4) * 2);
  return true;
LAB_0013cc93:
  *(undefined1 *)((long)&local_64 + lVar3) = local_60.m_p._0_1_;
  if (lVar3 == 3) {
    *(undefined4 *)((long)addr + uVar4 * 2 + -4) = local_64;
LAB_0013cbae:
    if (uVar5 != 0xffffffffffffffff) goto LAB_0013cbb4;
    bVar2 = true;
    if (uVar4 != 8) {
      err::Error::Error((Error *)&local_60,0x16);
      local_48.m_p = (ErrorHdr *)0x0;
      local_48.m_hdr = (BufHdr *)0x0;
      local_48.m_size = 0;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_60);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_60);
      err::setError((ErrorRef *)&local_48);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
LAB_0013ccc9:
      bVar2 = false;
    }
    return bVar2;
  }
  bVar2 = expectChar(this,'.');
  if (!bVar2) goto LAB_0013ccc9;
  lVar3 = lVar3 + 1;
  bVar2 = parseInt(this,(uint_t *)&local_60,10);
  if (!bVar2) goto LAB_0013ccc9;
  goto LAB_0013cc93;
}

Assistant:

bool
SockAddrParser::parse(in6_addr* addr) {
	bool result;

	uint16_t* ip = (uint16_t*)addr;

	size_t zeroRunIdx = -1;
	bool isIp4 = false;
	uchar_t ip4[4];

	tryChar(':');

	size_t i = 0;
	while (i < 8) {
		result = tryChar(':');
		if (result)
			zeroRunIdx = i;

		uint_t word;
		result = parseInt(&word, 16);
		if (!result)
			return false;

		result = tryChar(':');
		if (!result) {
			result = tryChar('.');
			if (result) {
				if (i > 6) {
					err::setError(err::SystemErrorCode_InvalidAddress);
					return false;
				}

				ip4[0] = (uchar_t)
					((word & 0x0f) +
					((word & 0xf0) >> 4) * 10 +
					((word & 0xf00) >> 8) * 100);

				isIp4 = true;
				break;
			}
		}

		ip[i] = sl::swapByteOrder16((uint16_t)word);
		i++;

		if (!result)
			break;
	}

	if (isIp4) {
		for (size_t j = 1;; j++) {
			uint_t octet;
			result = parseInt(&octet, 10);
			if (!result)
				return false;

			ip4[j] = (uchar_t)octet;

			if (j >= 3)
				break;

			result = expectChar('.');
			if (!result)
				return false;
		}

		ASSERT(i <= 6);
		ip[i] = ip4[0] + (ip4[1] << 8);
		ip[i + 1] = ip4[2] + (ip4[3] << 8);
		i += 2;
	}

	if (zeroRunIdx != -1) {
		ASSERT(i <= 8 && zeroRunIdx <= i);

		size_t zeroRunLength = 8 - i;

		if (zeroRunIdx < i) {
			memmove(&ip[zeroRunIdx + zeroRunLength], &ip[zeroRunIdx], (i - zeroRunIdx) * sizeof(uint16_t));
			memset(&ip[zeroRunIdx], 0, zeroRunLength * sizeof(uint16_t));
		}
	} else if (i != 8) {
		err::setError(err::SystemErrorCode_InvalidAddress);
		return false;
	}

	return true;
}